

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueTexture
          (GLCompiledProgram *this,ShaderSpecTexture *newTexture)

{
  pointer pGVar1;
  __type _Var2;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  GLShaderTexture local_68;
  
  __lhs = (this->textures).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pGVar1) {
      std::__cxx11::string::string((string *)&local_68,(string *)newTexture);
      local_68.dim = newTexture->dim;
      local_68.index = 0x309;
      local_68.isSet = false;
      local_68.textureBufferOwned.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68.textureBuffer = (GLTextureBuffer *)0x0;
      local_68.textureBufferOwned.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderTexture>_>
      ::emplace_back<polyscope::render::backend_openGL_mock::GLShaderTexture>
                (&this->textures,&local_68);
      GLShaderTexture::~GLShaderTexture(&local_68);
      return;
    }
    _Var2 = std::operator==(&__lhs->name,&newTexture->name);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  if (__lhs->dim == newTexture->dim) {
    return;
  }
  std::operator+(&local_68.name,"texture ",&__lhs->name);
  std::operator+(&bStack_88,&local_68.name," appears twice in program with different dimensions");
  exception(&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void GLCompiledProgram::addUniqueTexture(ShaderSpecTexture newTexture) {
  for (GLShaderTexture& t : textures) {
    if (t.name == newTexture.name) {

      // if it occurs twice, confirm that the occurences match
      if (t.dim != newTexture.dim)
        exception("texture " + t.name + " appears twice in program with different dimensions");

      return;
    }
  }
  textures.push_back(GLShaderTexture{newTexture.name, newTexture.dim, 777, false, nullptr, nullptr});
}